

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.c
# Opt level: O3

char * TextToUtf8(int *codepoints,int length)

{
  uint in_EAX;
  char *__ptr;
  char *pcVar1;
  ulong uVar2;
  size_t sVar3;
  long lVar4;
  int bytes;
  undefined8 uStack_38;
  
  sVar3 = 1;
  uStack_38._0_4_ = in_EAX;
  __ptr = (char *)calloc((long)(length * 5),1);
  uStack_38 = (ulong)(uint)uStack_38;
  if (0 < length) {
    uVar2 = 0;
    lVar4 = 0;
    do {
      CodepointToUtf8(codepoints[uVar2],(int *)((long)&uStack_38 + 4));
      sVar3 = (size_t)uStack_38._4_4_;
      memcpy(__ptr + (int)lVar4,CodepointToUtf8::utf8,sVar3);
      lVar4 = sVar3 + (long)(int)lVar4;
      uVar2 = uVar2 + 1;
    } while ((uint)length != uVar2);
    sVar3 = lVar4 + 1;
  }
  pcVar1 = (char *)realloc(__ptr,sVar3);
  if (pcVar1 == (char *)0x0) {
    pcVar1 = __ptr;
  }
  return pcVar1;
}

Assistant:

char *TextToUtf8(int *codepoints, int length)
{
    // We allocate enough memory fo fit all possible codepoints
    // NOTE: 5 bytes for every codepoint should be enough
    char *text = (char *)RL_CALLOC(length*5, 1);
    const char *utf8 = NULL;
    int size = 0;

    for (int i = 0, bytes = 0; i < length; i++)
    {
        utf8 = CodepointToUtf8(codepoints[i], &bytes);
        memcpy(text + size, utf8, bytes);
        size += bytes;
    }

    // Resize memory to text length + string NULL terminator
    void *ptr = RL_REALLOC(text, size + 1);

    if (ptr != NULL) text = (char *)ptr;

    return text;
}